

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::SplitBailOnImplicitCall
          (Lowerer *this,Instr *instr,Instr *helperCall,Instr *insertBeforeInstr)

{
  IntConstOpnd *opnd;
  BailOutInfo *bailOutInfo_00;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Instr *bailOutInstr;
  BailOutInfo *bailOutInfo;
  AutoReuseOpnd autoReuseNoImplicitCall;
  IntConstOpnd *noImplicitCall;
  AutoReuseOpnd autoReuseImplicitCallFlags;
  Opnd *implicitCallFlags;
  Instr *insertBeforeInstr_local;
  Instr *helperCall_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  autoReuseImplicitCallFlags._16_8_ = GetImplicitCallFlagsOpnd(this);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&noImplicitCall,(Opnd *)autoReuseImplicitCallFlags._16_8_,
             instr->m_func,true);
  opnd = IR::IntConstOpnd::New(1,TyInt8,this->m_func,true);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&bailOutInfo,&opnd->super_Opnd,instr->m_func,true);
  InsertMove((Opnd *)autoReuseImplicitCallFlags._16_8_,&opnd->super_Opnd,helperCall->m_prev,true);
  bailOutInfo_00 = IR::Instr::GetBailOutInfo(instr);
  if (bailOutInfo_00->bailOutInstr == instr) {
    bailOutInfo_00->bailOutInstr = (Instr *)0x0;
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotEqual,BailOutOnImplicitCalls,bailOutInfo_00,
                       bailOutInfo_00->bailOutFunc);
  IR::Instr::SetSrc1(&this_00->super_Instr,(Opnd *)autoReuseImplicitCallFlags._16_8_);
  IR::Instr::SetSrc2(&this_00->super_Instr,&opnd->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  IR::Instr::ClearBailOutInfo(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&bailOutInfo);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&noImplicitCall);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnImplicitCall(IR::Instr * instr, IR::Instr * helperCall, IR::Instr * insertBeforeInstr)
{
    IR::Opnd * implicitCallFlags = this->GetImplicitCallFlagsOpnd();
    const IR::AutoReuseOpnd autoReuseImplicitCallFlags(implicitCallFlags, instr->m_func);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, this->m_func, true);
    const IR::AutoReuseOpnd autoReuseNoImplicitCall(noImplicitCall, instr->m_func);

    // Reset the implicit call flag on every helper call
    Lowerer::InsertMove(implicitCallFlags, noImplicitCall, helperCall->m_prev);

    BailOutInfo * bailOutInfo = instr->GetBailOutInfo();
    if (bailOutInfo->bailOutInstr == instr)
    {
        bailOutInfo->bailOutInstr = nullptr;
    }
    IR::Instr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, IR::BailOutOnImplicitCalls, bailOutInfo, bailOutInfo->bailOutFunc);
    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);

    insertBeforeInstr->InsertBefore(bailOutInstr);
    instr->ClearBailOutInfo();
    return bailOutInstr;
}